

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O2

void __thiscall
google::protobuf::io::Printer::Annotate
          (Printer *this,string_view begin_varname,string_view end_varname,string_view file_path,
          vector<int,_std::allocator<int>_> *path,
          optional<google::protobuf::io::AnnotationCollector::Semantic> semantic)

{
  AnnotationCollector *pAVar1;
  string_view v;
  LogMessage *pLVar2;
  string_view v_00;
  PrintOptions opts;
  PrintOptions opts_00;
  optional<std::pair<unsigned_long,_unsigned_long>_> end;
  optional<std::pair<unsigned_long,_unsigned_long>_> begin;
  allocator<char> local_a1;
  char *local_a0;
  size_t local_98;
  char *local_90;
  vector<int,_std::allocator<int>_> *local_88;
  LogMessage local_80 [2];
  optional<std::pair<unsigned_long,_unsigned_long>_> local_60;
  _Storage<std::pair<unsigned_long,_unsigned_long>,_true> local_48;
  char local_38;
  ulong uVar3;
  
  local_a0 = begin_varname._M_str;
  v_00._M_len = begin_varname._M_len;
  if ((this->options_).annotation_collector != (AnnotationCollector *)0x0) {
    opts.use_annotation_frames = SUB81(path,0);
    opts.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
    _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
         (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)0x0;
    opts.checks_are_debug_only = true;
    opts.use_substitution_map = false;
    opts.use_curly_brace_substitutions = false;
    opts.allow_digit_substitutions = true;
    opts.strip_spaces_around_vars = true;
    opts.strip_raw_string_indentation = false;
    uVar3 = (ulong)path & 0xff;
    local_88 = path;
    GetSubstitutionRange
              ((optional<std::pair<unsigned_long,_unsigned_long>_> *)&local_48._M_value,this,
               begin_varname,opts);
    opts_00.use_annotation_frames = SUB81(uVar3,0);
    opts_00.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
    _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
         (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)0x0;
    opts_00.checks_are_debug_only = true;
    opts_00.use_substitution_map = false;
    opts_00.use_curly_brace_substitutions = false;
    opts_00.allow_digit_substitutions = true;
    opts_00.strip_spaces_around_vars = true;
    opts_00.strip_raw_string_indentation = false;
    local_98 = end_varname._M_len;
    local_90 = end_varname._M_str;
    GetSubstitutionRange(&local_60,this,end_varname,opts_00);
    if ((local_38 == '\x01') &&
       (local_60.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
        _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>._M_engaged
        == true)) {
      if (local_60.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
          _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>.
          _M_payload._M_value.second < local_48._M_value.first) {
        absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                  ((LogMessageDebugFatal *)local_80,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.cc"
                   ,0x189);
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (local_80,(char (*) [37])"annotation has negative length from ");
        v_00._M_str = local_a0;
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,v_00);
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar2,(char (*) [5])0x44c0b9);
        v._M_str = local_90;
        v._M_len = local_98;
        absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,v);
        absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
                  ((LogMessageDebugFatal *)local_80);
      }
      else {
        pAVar1 = (this->options_).annotation_collector;
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)local_80,&file_path,&local_a1);
        (*pAVar1->_vptr_AnnotationCollector[3])
                  (pAVar1,local_48._M_value.first,
                   local_60.
                   super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                   _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>
                   ._M_payload._M_value.second,local_80,local_88,
                   semantic.
                   super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>
                  );
        std::__cxx11::string::~string((string *)local_80);
      }
    }
  }
  return;
}

Assistant:

void Printer::Annotate(absl::string_view begin_varname,
                       absl::string_view end_varname,
                       absl::string_view file_path,
                       const std::vector<int>& path,
                       absl::optional<AnnotationCollector::Semantic> semantic) {
  if (options_.annotation_collector == nullptr) {
    return;
  }

  PrintOptions opts;
  opts.checks_are_debug_only = true;
  auto begin = GetSubstitutionRange(begin_varname, opts);
  auto end = GetSubstitutionRange(end_varname, opts);
  if (!begin.has_value() || !end.has_value()) {
    return;
  }
  if (begin->first > end->second) {
    ABSL_DLOG(FATAL) << "annotation has negative length from " << begin_varname
                     << " to " << end_varname;
    return;
  }
  options_.annotation_collector->AddAnnotation(
      begin->first, end->second, std::string(file_path), path, semantic);
}